

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdfcommon.c
# Opt level: O2

FT_16D16 square_root(FT_16D16 val)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (ulong)val;
  lVar2 = 0;
  for (uVar4 = 0x40000000; 0x40 < uVar4; uVar4 = uVar4 >> 1) {
    uVar1 = uVar4 + lVar2;
    if (uVar1 <= uVar3) {
      lVar2 = uVar1 + uVar4;
    }
    uVar5 = 0;
    if (uVar1 <= uVar3) {
      uVar5 = uVar1;
    }
    uVar3 = (uVar3 - uVar5) * 2;
  }
  return (FT_16D16)((ulong)lVar2 >> 8);
}

Assistant:

FT_LOCAL_DEF( FT_16D16 )
  square_root( FT_16D16  val )
  {
    FT_ULong  t, q, b, r;


    r = (FT_ULong)val;
    b = 0x40000000L;
    q = 0;

    while ( b > 0x40L )
    {
      t = q + b;

      if ( r >= t )
      {
        r -= t;
        q  = t + b;
      }

      r <<= 1;
      b >>= 1;
    }

    q >>= 8;

    return (FT_16D16)q;
  }